

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

Parser * __thiscall xLearn::Reader::CreateParser(Reader *this,char *format_name)

{
  ObjectCreatorRegistry_xLearn_parser_registry *this_00;
  Parser *pPVar1;
  allocator local_39;
  string local_38;
  
  this_00 = GetRegistry_xLearn_parser_registry();
  std::__cxx11::string::string((string *)&local_38,format_name,&local_39);
  pPVar1 = ObjectCreatorRegistry_xLearn_parser_registry::CreateObject(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pPVar1;
}

Assistant:

Parser* CreateParser(const char* format_name) {
    return CREATE_PARSER(format_name);
  }